

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TreeNodeBehavior(ImGuiID id,ImGuiTreeNodeFlags flags,char *label,char *label_end)

{
  ImU32 *pIVar1;
  ImGuiItemStatusFlags *pIVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  ImVec2 pos;
  ImVec2 pos_00;
  ImVec2 pos_01;
  ImVec2 pos_02;
  ImVec2 IVar5;
  ImVec2 p_min;
  ImVec2 p_min_00;
  ImVec2 IVar6;
  ImVec2 p_max;
  ImVec2 p_max_00;
  ImGuiContext *pIVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  byte bVar11;
  float fVar12;
  ImU32 IVar13;
  ImGuiWindowTempData *pIVar14;
  ImGuiID IVar15;
  uint uVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  bool held;
  bool hovered;
  float local_ec;
  ImVec2 local_e8;
  ImRect local_e0;
  float local_d0;
  char log_suffix [3];
  char log_prefix [4];
  ImVec2 label_size;
  ImRect interact_bb;
  ImVec2 local_50;
  undefined1 local_48 [16];
  
  pIVar7 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->WriteAccessed = true;
  if (pIVar4->SkipItems != false) {
    return false;
  }
  if ((flags & 0x402U) == 0) {
    fVar12 = (pIVar4->DC).CurrLineTextBaseOffset;
    fVar3 = (pIVar7->Style).FramePadding.y;
    if (fVar3 <= fVar12) {
      fVar12 = fVar3;
    }
  }
  else {
    fVar12 = (pIVar7->Style).FramePadding.y;
  }
  fVar3 = (pIVar7->Style).FramePadding.x;
  if (label_end == (char *)0x0) {
    label_end = FindRenderedTextEnd(label,(char *)0x0);
  }
  label_size = CalcTextSize(label,label_end,false,-1.0);
  pIVar14 = (ImGuiWindowTempData *)&pIVar4->WorkRect;
  if (((uint)flags >> 0xc & 1) == 0) {
    pIVar14 = &pIVar4->DC;
  }
  fVar20 = (pIVar4->DC).CurrLineSize.y;
  fVar18 = pIVar7->FontSize;
  fVar19 = (pIVar7->Style).FramePadding.y;
  fVar19 = fVar19 + fVar19 + fVar18;
  if (fVar19 <= fVar20) {
    fVar20 = fVar19;
  }
  fVar19 = fVar12 + fVar12 + label_size.y;
  uVar17 = -(uint)(fVar19 <= fVar20);
  interact_bb.Min.y = (float)(uVar17 & (uint)fVar20 | ~uVar17 & (uint)fVar19);
  local_d0 = (pIVar14->CursorPos).x;
  local_e0.Min.y = (pIVar4->DC).CursorPos.y;
  local_e0.Max.x = (pIVar4->WorkRect).Max.x;
  local_e0.Max.y = interact_bb.Min.y + local_e0.Min.y;
  if ((flags & 2U) == 0) {
    fVar20 = 2.0;
  }
  else {
    fVar20 = (pIVar4->WindowPadding).x * 0.5;
    local_d0 = local_d0 - (float)(int)(fVar20 + -1.0);
    local_e0.Max.x = local_e0.Max.x + (float)(int)fVar20;
    fVar20 = 3.0;
  }
  fVar19 = fVar20 * fVar3 + fVar18;
  fVar20 = (pIVar4->DC).CurrLineTextBaseOffset;
  uVar17 = -(uint)(fVar20 <= fVar12);
  local_ec = fVar3 + fVar3;
  interact_bb.Min.x =
       (float)(-(uint)(0.0 < label_size.x) & (uint)(local_ec + label_size.x)) + fVar18;
  fVar18 = (pIVar4->DC).CursorPos.x + fVar19;
  local_e8.y = (float)(~uVar17 & (uint)fVar20 | uVar17 & (uint)fVar12) + local_e0.Min.y;
  local_e8.x = fVar18;
  local_48 = ZEXT416((uint)interact_bb.Min.x);
  local_e0.Min.x = local_d0;
  ItemSize(&interact_bb.Min,fVar12);
  interact_bb.Min.y = local_e0.Min.y;
  interact_bb.Min.x = local_e0.Min.x;
  interact_bb.Max.x = local_e0.Max.x;
  if ((flags & 0x1802U) == 0) {
    fVar12 = (pIVar7->Style).ItemSpacing.x;
    interact_bb.Max.x = fVar12 + fVar12 + (float)local_48._0_4_ + local_d0;
  }
  interact_bb.Max.y = local_e0.Max.y;
  bVar8 = TreeNodeBehaviorIsOpen(id,flags);
  if (((bVar8) && ((flags & 0x2008U) == 0x2000)) && (pIVar7->NavIdIsAlive == false)) {
    pIVar1 = &(pIVar4->DC).TreeJumpToParentOnPopMask;
    *pIVar1 = *pIVar1 | 1 << ((byte)(pIVar4->DC).TreeDepth & 0x1f);
  }
  bVar9 = ItemAdd(&interact_bb,id,(ImRect *)0x0);
  pIVar2 = &(pIVar4->DC).LastItemStatusFlags;
  *(byte *)pIVar2 = (byte)*pIVar2 | 2;
  IVar5.y = local_e0.Min.y;
  IVar5.x = local_e0.Min.x;
  IVar6.y = local_e0.Max.y;
  IVar6.x = local_e0.Max.x;
  (pIVar4->DC).LastItemDisplayRect.Min = IVar5;
  (pIVar4->DC).LastItemDisplayRect.Max = IVar6;
  if (!bVar9) {
    if (!bVar8 || (char)((flags & 8U) >> 3) != '\0') {
      return bVar8;
    }
    TreePushOverrideID(0);
    return true;
  }
  uVar17 = 4;
  if ((flags & 0x40U) != 0) {
    uVar17 = (uint)flags >> 5 & 4 | 0x20;
  }
  uVar16 = uVar17 + 0x40;
  if (((uint)flags >> 8 & 1) != 0) {
    uVar16 = uVar17;
  }
  uVar16 = uVar16 + (flags & 4U) * 0x40;
  fVar12 = (pIVar7->Style).TouchExtraPadding.x;
  fVar18 = fVar18 - fVar19;
  fVar20 = fVar18 - fVar12;
  local_ec = local_ec + pIVar7->FontSize + fVar18 + fVar12;
  if (((pIVar4 != pIVar7->HoveredWindow) || (fVar12 = (pIVar7->IO).MousePos.x, fVar12 < fVar20)) ||
     (local_ec <= fVar12)) {
    uVar16 = uVar16 | 0x1000;
  }
  bVar9 = ButtonBehavior(&interact_bb,id,&hovered,&held,uVar16);
  if (((uint)flags >> 8 & 1) != 0) goto LAB_001f7b9a;
  if (bVar9) {
    if (((flags & 0xc0U) == 0) || (pIVar7->NavActivateId == id)) {
      bVar10 = 1;
    }
    else {
      bVar10 = 0;
    }
    if ((char)flags < '\0') {
      fVar12 = (pIVar7->IO).MousePos.x;
      bVar11 = 0;
      if ((fVar20 <= fVar12) && (bVar11 = 0, fVar12 < local_ec)) {
        bVar11 = pIVar7->NavDisableMouseHover ^ 1;
      }
      bVar10 = bVar10 | bVar11;
    }
    if (((flags & 0x40U) != 0) && ((pIVar7->IO).MouseDoubleClicked[0] != false)) {
      bVar10 = 1;
    }
    bVar11 = 0;
    if (pIVar7->DragDropActive == false) {
      bVar11 = bVar10;
    }
    if (!bVar8) {
      bVar11 = bVar10;
    }
  }
  else {
    bVar11 = 0;
  }
  IVar15 = pIVar7->NavId;
  if (IVar15 == id) {
    if ((pIVar7->NavMoveRequest == true) && (bVar8 && pIVar7->NavMoveDir == 0)) {
      NavMoveRequestCancel();
      IVar15 = pIVar7->NavId;
      bVar11 = 1;
      goto LAB_001f7b53;
    }
LAB_001f7b57:
    if ((pIVar7->NavMoveRequest != true) || (pIVar7->NavMoveDir != 1 || bVar8)) goto LAB_001f7b71;
    NavMoveRequestCancel();
  }
  else {
LAB_001f7b53:
    if (IVar15 == id) goto LAB_001f7b57;
LAB_001f7b71:
    if (bVar11 == 0) goto LAB_001f7b9a;
  }
  bVar8 = !bVar8;
  ImGuiStorage::SetInt((pIVar4->DC).StateStorage,id,(uint)bVar8);
  pIVar2 = &(pIVar4->DC).LastItemStatusFlags;
  *(byte *)pIVar2 = (byte)*pIVar2 | 0x10;
LAB_001f7b9a:
  if ((flags & 4U) != 0) {
    SetItemAllowOverlap();
  }
  fVar12 = (float)GetColorU32(0,1.0);
  if ((flags & 2U) == 0) {
    if (((flags & 1U) == 0 & (hovered ^ 1U)) == 0) {
      uVar17 = 0x1a;
      if ((held & hovered) == 0) {
        uVar17 = hovered | 0x18;
      }
      local_ec = fVar12;
      IVar13 = GetColorU32(uVar17,1.0);
      p_min.y = local_e0.Min.y;
      p_min.x = local_e0.Min.x;
      p_max.y = local_e0.Max.y;
      p_max.x = local_e0.Max.x;
      RenderFrame(p_min,p_max,IVar13,false,0.0);
      RenderNavHighlight(&local_e0,id,2);
      fVar12 = local_ec;
    }
    if (((uint)flags >> 9 & 1) == 0) {
      if (((uint)flags >> 8 & 1) == 0) {
        pos_02.y = pIVar7->FontSize * 0.15 + local_e8.y;
        pos_02.x = fVar3 + (local_e8.x - fVar19);
        RenderArrow(pIVar4->DrawList,pos_02,(ImU32)fVar12,(uint)bVar8 * 2 + 1,0.7);
      }
    }
    else {
      pos_01.y = pIVar7->FontSize * 0.5 + local_e8.y;
      pos_01.x = -fVar19 * 0.5 + local_e8.x;
      RenderBullet(pIVar4->DrawList,pos_01,(ImU32)fVar12);
    }
    if (pIVar7->LogEnabled == true) {
      LogRenderedText(&local_e8,">",(char *)0x0);
    }
    RenderText(local_e8,label,label_end,false);
  }
  else {
    uVar16 = (held ^ 1U) & hovered | 0x18;
    uVar17 = 0x1a;
    if ((hovered & 1U) == 0) {
      uVar17 = uVar16;
    }
    if (held == false) {
      uVar17 = uVar16;
    }
    local_ec = fVar12;
    IVar13 = GetColorU32(uVar17,1.0);
    p_min_00.y = local_e0.Min.y;
    p_min_00.x = local_e0.Min.x;
    p_max_00.y = local_e0.Max.y;
    p_max_00.x = local_e0.Max.x;
    RenderFrame(p_min_00,p_max_00,IVar13,true,(pIVar7->Style).FrameRounding);
    RenderNavHighlight(&local_e0,id,2);
    if (((uint)flags >> 9 & 1) == 0) {
      if (((uint)flags >> 8 & 1) == 0) {
        pos_00.y = local_e8.y;
        pos_00.x = fVar3 + (local_e8.x - fVar19);
        RenderArrow(pIVar4->DrawList,pos_00,(ImU32)local_ec,bVar8 + 1 + (uint)bVar8,1.0);
      }
      else {
        local_e8.x = local_e8.x - fVar19;
      }
    }
    else {
      pos.y = pIVar7->FontSize * 0.5 + local_e8.y;
      pos.x = -fVar19 * 0.6 + local_e8.x;
      RenderBullet(pIVar4->DrawList,pos,(ImU32)local_ec);
    }
    if (((uint)flags >> 0x14 & 1) != 0) {
      local_e0.Max.x = local_e0.Max.x - (pIVar7->FontSize + (pIVar7->Style).FramePadding.x);
    }
    if (pIVar7->LogEnabled == true) {
      builtin_strncpy(log_prefix,"\n##",4);
      log_suffix[2] = '\0';
      log_suffix[0] = '#';
      log_suffix[1] = '#';
      LogRenderedText(&local_e8,log_prefix,log_prefix + 3);
      local_50.x = 0.0;
      local_50.y = 0.0;
      RenderTextClipped(&local_e8,&local_e0.Max,label,label_end,&label_size,&local_50,(ImRect *)0x0)
      ;
      LogRenderedText(&local_e8,log_suffix,log_suffix + 2);
    }
    else {
      local_50.x = 0.0;
      local_50.y = 0.0;
      RenderTextClipped(&local_e8,&local_e0.Max,label,label_end,&label_size,&local_50,(ImRect *)0x0)
      ;
    }
  }
  if (bVar8 == true && (char)((flags & 8U) >> 3) == '\0') {
    TreePushOverrideID(0);
  }
  return bVar8;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}